

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int num;
  uint uVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  DIR *__dirp;
  dirent *pdVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var6;
  ostream *poVar7;
  int iVar8;
  int j;
  int iVar9;
  int num_00;
  double dVar10;
  double dVar11;
  double dVar12;
  int local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  vector<int,_std::allocator<int>_> dirnames;
  char dirname_c [8];
  string lastdirname;
  string dirname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  string local_680;
  regex re;
  char lastdirname_c [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  ofstream fout;
  uint auStack_5f8 [120];
  poscar p00;
  poscar pnn;
  poscar local_288;
  poscar local_1c0;
  poscar delta;
  
  dirnames.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  dirnames.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  dirnames.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex(&re,"\\d+",0x10);
  __dirp = opendir("./");
  if (__dirp == (DIR *)0x0) {
    poVar7 = std::operator<<((ostream *)&std::cout,"No Directory");
    std::endl<char,std::char_traits<char>>(poVar7);
    local_738 = -1;
  }
  else {
    while (pdVar5 = readdir(__dirp), pdVar5 != (dirent *)0x0) {
      if (pdVar5->d_type == '\x04') {
        bVar3 = std::regex_match<char,std::__cxx11::regex_traits<char>>(pdVar5->d_name,&re,0);
        if (bVar3) {
          std::__cxx11::string::string((string *)&fout,pdVar5->d_name,(allocator *)&pnn);
          p00._0_4_ = std::__cxx11::stoi((string *)&fout,(size_t *)0x0,10);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(&dirnames,(int *)&p00);
          std::__cxx11::string::~string((string *)&fout);
        }
      }
    }
    _Var6 = std::
            __max_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (dirnames.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       dirnames.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    num = *_Var6._M_current;
    sprintf(lastdirname_c,"%02d");
    std::__cxx11::string::string((string *)&lastdirname,lastdirname_c,(allocator *)&fout);
    std::__cxx11::string::string((string *)&local_680,"00/POSCAR",(allocator *)&fout);
    local_738 = -1;
    poscar::poscar(&p00,&local_680);
    std::__cxx11::string::~string((string *)&local_680);
    bVar3 = poscar::isReady(&p00);
    if (bVar3) {
      std::operator+(&local_6a0,&lastdirname,"/POSCAR");
      poscar::poscar(&pnn,&local_6a0);
      std::__cxx11::string::~string((string *)&local_6a0);
      bVar3 = poscar::isReady(&pnn);
      if (bVar3) {
        poscar::poscar(&local_1c0,&p00);
        poscar::poscar(&local_288,&pnn);
        poscar::poscar(&delta,&local_1c0,&local_288,num);
        poscar::~poscar(&local_288);
        poscar::~poscar(&local_1c0);
        iVar8 = 1;
        local_738 = 0;
        do {
          if (num <= iVar8) {
            local_738 = 0;
            break;
          }
          sprintf(dirname_c,"%02d");
          std::__cxx11::string::string((string *)&dirname,dirname_c,(allocator *)&fout);
          mkdir(dirname_c,0x1ed);
          std::operator+(&local_728,&dirname,"/POSCAR");
          std::ofstream::ofstream(&fout,(string *)&local_728,_S_out);
          std::__cxx11::string::~string((string *)&local_728);
          uVar1 = *(uint *)((long)auStack_5f8 + *(long *)(_fout + -0x18));
          if ((uVar1 & 5) == 0) {
            poscar::getTitle_abi_cxx11_(&local_728,&delta);
            poVar7 = std::operator<<((ostream *)&fout,(string *)&local_728);
            std::endl<char,std::char_traits<char>>(poVar7);
            std::__cxx11::string::~string((string *)&local_728);
            poVar7 = std::operator<<((ostream *)&fout,"   ");
            lVar2 = *(long *)poVar7;
            *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
                 *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
            *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 0x12;
            *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 8) = 0x10;
            dVar10 = poscar::getScale(&p00);
            dVar11 = poscar::getScale(&delta);
            dVar12 = (double)iVar8;
            poVar7 = std::ostream::_M_insert<double>(dVar11 * dVar12 + dVar10);
            std::endl<char,std::char_traits<char>>(poVar7);
            poVar7 = std::operator<<((ostream *)&fout,"    ");
            lVar2 = *(long *)poVar7;
            *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
                 *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
            *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 0x13;
            *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 8) = 0x10;
            dVar10 = poscar::getLattice(&p00,0);
            dVar11 = poscar::getLattice(&delta,0);
            poVar7 = std::ostream::_M_insert<double>(dVar11 * dVar12 + dVar10);
            poVar7 = std::operator<<(poVar7,"   ");
            lVar2 = *(long *)poVar7;
            *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
                 *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
            *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 0x13;
            *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 8) = 0x10;
            dVar10 = poscar::getLattice(&p00,1);
            dVar11 = poscar::getLattice(&delta,1);
            poVar7 = std::ostream::_M_insert<double>(dVar11 * dVar12 + dVar10);
            poVar7 = std::operator<<(poVar7,"   ");
            lVar2 = *(long *)poVar7;
            *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
                 *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
            *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 0x13;
            *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 8) = 0x10;
            dVar10 = poscar::getLattice(&p00,2);
            dVar11 = poscar::getLattice(&delta,2);
            poVar7 = std::ostream::_M_insert<double>(dVar11 * dVar12 + dVar10);
            std::endl<char,std::char_traits<char>>(poVar7);
            poVar7 = std::operator<<((ostream *)&fout,"    ");
            lVar2 = *(long *)poVar7;
            *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
                 *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
            *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 0x13;
            *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 8) = 0x10;
            dVar10 = poscar::getLattice(&p00,3);
            dVar11 = poscar::getLattice(&delta,3);
            poVar7 = std::ostream::_M_insert<double>(dVar11 * dVar12 + dVar10);
            poVar7 = std::operator<<(poVar7,"   ");
            lVar2 = *(long *)poVar7;
            *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
                 *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
            *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 0x13;
            *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 8) = 0x10;
            dVar10 = poscar::getLattice(&p00,4);
            dVar11 = poscar::getLattice(&delta,4);
            poVar7 = std::ostream::_M_insert<double>(dVar11 * dVar12 + dVar10);
            poVar7 = std::operator<<(poVar7,"   ");
            lVar2 = *(long *)poVar7;
            *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
                 *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
            *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 0x13;
            *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 8) = 0x10;
            dVar10 = poscar::getLattice(&p00,5);
            dVar11 = poscar::getLattice(&delta,5);
            poVar7 = std::ostream::_M_insert<double>(dVar11 * dVar12 + dVar10);
            std::endl<char,std::char_traits<char>>(poVar7);
            poVar7 = std::operator<<((ostream *)&fout,"    ");
            lVar2 = *(long *)poVar7;
            *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
                 *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
            *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 0x13;
            *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 8) = 0x10;
            dVar10 = poscar::getLattice(&p00,6);
            dVar11 = poscar::getLattice(&delta,6);
            poVar7 = std::ostream::_M_insert<double>(dVar11 * dVar12 + dVar10);
            poVar7 = std::operator<<(poVar7,"   ");
            lVar2 = *(long *)poVar7;
            *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
                 *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
            *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 0x13;
            *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 8) = 0x10;
            dVar10 = poscar::getLattice(&p00,7);
            dVar11 = poscar::getLattice(&delta,7);
            poVar7 = std::ostream::_M_insert<double>(dVar11 * dVar12 + dVar10);
            poVar7 = std::operator<<(poVar7,"   ");
            lVar2 = *(long *)poVar7;
            *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
                 *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
            *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 0x13;
            *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 8) = 0x10;
            dVar10 = poscar::getLattice(&p00,8);
            dVar11 = poscar::getLattice(&delta,8);
            poVar7 = std::ostream::_M_insert<double>(dVar11 * dVar12 + dVar10);
            std::endl<char,std::char_traits<char>>(poVar7);
            poVar7 = std::operator<<((ostream *)&fout,"   ");
            poscar::getElementsAsString_abi_cxx11_(&local_728,&delta);
            poVar7 = std::operator<<(poVar7,(string *)&local_728);
            std::endl<char,std::char_traits<char>>(poVar7);
            std::__cxx11::string::~string((string *)&local_728);
            poVar7 = std::operator<<((ostream *)&fout,"   ");
            poscar::getAtomNumsAsString_abi_cxx11_(&local_728,&delta);
            poVar7 = std::operator<<(poVar7,(string *)&local_728);
            std::endl<char,std::char_traits<char>>(poVar7);
            std::__cxx11::string::~string((string *)&local_728);
            poVar7 = std::operator<<((ostream *)&fout,"Direct");
            std::endl<char,std::char_traits<char>>(poVar7);
            num_00 = 2;
            for (iVar9 = 0; iVar4 = poscar::getAtomNum(&delta), iVar9 < iVar4; iVar9 = iVar9 + 1) {
              poVar7 = std::operator<<((ostream *)&fout," ");
              lVar2 = *(long *)poVar7;
              *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
                   *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
              *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 0x13;
              *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 8) = 0x10;
              dVar10 = poscar::getCood(&p00,num_00 + -2);
              dVar11 = poscar::getCood(&delta,num_00 + -2);
              poVar7 = std::ostream::_M_insert<double>(dVar11 * dVar12 + dVar10);
              poVar7 = std::operator<<(poVar7," ");
              lVar2 = *(long *)poVar7;
              *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
                   *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
              *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 0x13;
              *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 8) = 0x10;
              dVar10 = poscar::getCood(&p00,num_00 + -1);
              dVar11 = poscar::getCood(&delta,num_00 + -1);
              poVar7 = std::ostream::_M_insert<double>(dVar11 * dVar12 + dVar10);
              poVar7 = std::operator<<(poVar7," ");
              lVar2 = *(long *)poVar7;
              *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) =
                   *(uint *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
              *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 0x10) = 0x13;
              *(undefined8 *)(poVar7 + *(long *)(lVar2 + -0x18) + 8) = 0x10;
              dVar10 = poscar::getCood(&p00,num_00);
              dVar11 = poscar::getCood(&delta,num_00);
              poVar7 = std::ostream::_M_insert<double>(dVar11 * dVar12 + dVar10);
              std::endl<char,std::char_traits<char>>(poVar7);
              num_00 = num_00 + 3;
            }
          }
          else {
            std::operator+(&local_638,"Error during making ",&dirname);
            std::operator+(&local_728,&local_638,"/POSCAR!");
            poVar7 = std::operator<<((ostream *)&std::cout,(string *)&local_728);
            std::endl<char,std::char_traits<char>>(poVar7);
            std::__cxx11::string::~string((string *)&local_728);
            std::__cxx11::string::~string((string *)&local_638);
            local_738 = -1;
          }
          std::ofstream::~ofstream(&fout);
          std::__cxx11::string::~string((string *)&dirname);
          iVar8 = iVar8 + 1;
        } while ((uVar1 & 5) == 0);
        poscar::~poscar(&delta);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                       &lastdirname,"/POSCAR was not read.");
        poVar7 = std::operator<<((ostream *)&std::cout,(string *)&fout);
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::string::~string((string *)&fout);
        local_738 = -1;
      }
      poscar::~poscar(&pnn);
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cout,"00/POSCAR was not read.");
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    poscar::~poscar(&p00);
    std::__cxx11::string::~string((string *)&lastdirname);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&re);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&dirnames.super__Vector_base<int,_std::allocator<int>_>);
  return local_738;
}

Assistant:

int main() {

    // ディレクトリ取得
    vector<int> dirnames;
    regex re("\\d+");
    DIR *dp;        // pointer for directory
    dirent *entry;  // entry point returned by readdir()

    dp = opendir("./");
    if (dp == NULL) {
        cout << "No Directory" << endl;
        return -1;
    }
    do {
        entry = readdir(dp);
        if (entry != NULL) {
            if (entry->d_type == DT_DIR) {
                if (regex_match(entry->d_name, re)) {
                    dirnames.push_back(stoi(entry->d_name));
                }
            }
        }
    } while (entry != NULL);

    int maxdirnum = *max_element(dirnames.begin(), dirnames.end());
    char lastdirname_c[8];
    sprintf(lastdirname_c, "%02d", maxdirnum);
    string lastdirname = string(lastdirname_c);

    // read POSCAR
    poscar p00("00/POSCAR");
    if (!p00.isReady()) {
        cout << "00/POSCAR was not read." << endl;
        return -1;
    }
    poscar pnn(lastdirname + "/POSCAR");
    if (!pnn.isReady()) {
        cout << lastdirname + "/POSCAR was not read." << endl;
        return -1;
    }

    // delta POSCAR
    poscar delta(p00, pnn, maxdirnum);

    // make directory
    for (int i = 1; i < maxdirnum; i++) {
        char dirname_c[8];
        sprintf(dirname_c, "%02d", i);
        string dirname = string(dirname_c);
        const char *dirname_cc = dirname_c;
        mkdir(dirname_cc, 0755);

        // make poscar
        ofstream fout(dirname + "/POSCAR");
        if (!fout) {
            cout << "Error during making " + dirname + "/POSCAR!" << endl;
            return -1;
        }

        fout << delta.getTitle() << endl;
        fout << "   "  << fixed << setw(18) << setprecision(16) << p00.getScale() + delta.getScale() * i << endl;
        fout << "    " << fixed << setw(19) << setprecision(16) << p00.getLattice(0) + delta.getLattice(0) * i
             << "   "  << fixed << setw(19) << setprecision(16) << p00.getLattice(1) + delta.getLattice(1) * i
             << "   "  << fixed << setw(19) << setprecision(16) << p00.getLattice(2) + delta.getLattice(2) * i << endl;
        fout << "    " << fixed << setw(19) << setprecision(16) << p00.getLattice(3) + delta.getLattice(3) * i
             << "   "  << fixed << setw(19) << setprecision(16) << p00.getLattice(4) + delta.getLattice(4) * i
             << "   "  << fixed << setw(19) << setprecision(16) << p00.getLattice(5) + delta.getLattice(5) * i << endl;
        fout << "    " << fixed << setw(19) << setprecision(16) << p00.getLattice(6) + delta.getLattice(6) * i
             << "   "  << fixed << setw(19) << setprecision(16) << p00.getLattice(7) + delta.getLattice(7) * i
             << "   "  << fixed << setw(19) << setprecision(16) << p00.getLattice(8) + delta.getLattice(8) * i << endl;
        fout << "   "  << delta.getElementsAsString() << endl;
        fout << "   "  << delta.getAtomNumsAsString() << endl;
        fout << "Direct" << endl;
        for (int j = 0; j < delta.getAtomNum(); j++) {
            fout << " " << fixed << setw(19) << setprecision(16) << p00.getCood(0 + 3*j) + delta.getCood(0 + 3*j) * i
                 << " " << fixed << setw(19) << setprecision(16) << p00.getCood(1 + 3*j) + delta.getCood(1 + 3*j) * i
                 << " " << fixed << setw(19) << setprecision(16) << p00.getCood(2 + 3*j) + delta.getCood(2 + 3*j) * i << endl;
        }

    }

    return 0;
}